

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void wasm::
     PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
     ::scan(Scanner *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  If *pIVar2;
  Loop *pLVar3;
  Break *pBVar4;
  Switch *pSVar5;
  Call *pCVar6;
  CallIndirect *pCVar7;
  LocalSet *pLVar8;
  GlobalSet *pGVar9;
  Load *pLVar10;
  Store *pSVar11;
  AtomicRMW *pAVar12;
  AtomicCmpxchg *pAVar13;
  AtomicWait *pAVar14;
  AtomicNotify *pAVar15;
  SIMDExtract *pSVar16;
  SIMDReplace *pSVar17;
  SIMDShuffle *pSVar18;
  size_type sVar19;
  SIMDTernary *pSVar20;
  SIMDShift *pSVar21;
  SIMDLoad *pSVar22;
  SIMDLoadStoreLane *pSVar23;
  MemoryInit *pMVar24;
  MemoryCopy *pMVar25;
  MemoryFill *pMVar26;
  Unary *pUVar27;
  Binary *pBVar28;
  Select *pSVar29;
  Drop *pDVar30;
  Return *pRVar31;
  MemoryGrow *pMVar32;
  RefIsNull *pRVar33;
  RefEq *pRVar34;
  TableGet *pTVar35;
  TableSet *pTVar36;
  TableGrow *pTVar37;
  TableFill *pTVar38;
  TableCopy *pTVar39;
  TableInit *pTVar40;
  Try *pTVar41;
  TryTable *pTVar42;
  Throw *pTVar43;
  ThrowRef *pTVar44;
  TupleMake *pTVar45;
  TupleExtract *pTVar46;
  RefI31 *pRVar47;
  I31Get *pIVar48;
  CallRef *pCVar49;
  RefTest *pRVar50;
  RefCast *pRVar51;
  BrOn *pBVar52;
  StructNew *pSVar53;
  StructGet *pSVar54;
  StructSet *pSVar55;
  StructRMW *pSVar56;
  StructCmpxchg *pSVar57;
  ArrayNew *pAVar58;
  ArrayNewData *pAVar59;
  ArrayNewElem *pAVar60;
  ArrayNewFixed *pAVar61;
  ArrayGet *pAVar62;
  ArraySet *pAVar63;
  ArrayLen *pAVar64;
  ArrayCopy *pAVar65;
  ArrayFill *pAVar66;
  ArrayInitData *pAVar67;
  ArrayInitElem *pAVar68;
  RefAs *pRVar69;
  StringNew *pSVar70;
  StringMeasure *pSVar71;
  StringEncode *pSVar72;
  StringConcat *pSVar73;
  StringEq *pSVar74;
  StringWTF16Get *pSVar75;
  StringSliceWTF *pSVar76;
  ContNew *pCVar77;
  ContBind *pCVar78;
  Suspend *pSVar79;
  Resume *pRVar80;
  ResumeThrow *pRVar81;
  StackSwitch *pSVar82;
  size_t sVar83;
  Expression **ppEVar84;
  int local_3b4;
  int i_26;
  StackSwitch *cast_94;
  Index i_25;
  Index i_24;
  int i_23;
  Index i_22;
  ResumeThrow *cast_93;
  Index i_21;
  Index i_20;
  int i_19;
  Index i_18;
  Resume *cast_92;
  int i_17;
  Suspend *cast_91;
  int i_16;
  ContBind *cast_90;
  ContNew *cast_89;
  StringSliceWTF *cast_88;
  StringWTF16Get *cast_87;
  StringEq *cast_86;
  StringConcat *cast_85;
  StringEncode *cast_84;
  StringMeasure *cast_83;
  StringConst *cast_82;
  StringNew *cast_81;
  RefAs *cast_80;
  ArrayInitElem *cast_79;
  ArrayInitData *cast_78;
  ArrayFill *cast_77;
  ArrayCopy *cast_76;
  ArrayLen *cast_75;
  ArraySet *cast_74;
  ArrayGet *cast_73;
  int i_15;
  ArrayNewFixed *cast_72;
  ArrayNewElem *cast_71;
  ArrayNewData *cast_70;
  ArrayNew *cast_69;
  StructCmpxchg *cast_68;
  StructRMW *cast_67;
  StructSet *cast_66;
  StructGet *cast_65;
  int i_14;
  StructNew *cast_64;
  BrOn *cast_63;
  RefCast *cast_62;
  RefTest *cast_61;
  int i_13;
  CallRef *cast_60;
  I31Get *cast_59;
  RefI31 *cast_58;
  TupleExtract *cast_57;
  int i_12;
  TupleMake *cast_56;
  Pop *cast_55;
  Unreachable *cast_54;
  Nop *cast_53;
  ThrowRef *cast_52;
  Rethrow *cast_51;
  int i_11;
  Throw *cast_50;
  Index i_10;
  Index i_9;
  Index i_8;
  Index i_7;
  TryTable *cast_49;
  Index i_6;
  int i_5;
  Try *cast_48;
  TableInit *cast_47;
  TableCopy *cast_46;
  TableFill *cast_45;
  TableGrow *cast_44;
  TableSize *cast_43;
  TableSet *cast_42;
  TableGet *cast_41;
  RefEq *cast_40;
  RefFunc *cast_39;
  RefIsNull *cast_38;
  RefNull *cast_37;
  MemoryGrow *cast_36;
  MemorySize *cast_35;
  Return *cast_34;
  Drop *cast_33;
  Select *cast_32;
  Binary *cast_31;
  Unary *cast_30;
  Const *cast_29;
  MemoryFill *cast_28;
  MemoryCopy *cast_27;
  DataDrop *cast_26;
  MemoryInit *cast_25;
  SIMDLoadStoreLane *cast_24;
  SIMDLoad *cast_23;
  SIMDShift *cast_22;
  SIMDTernary *cast_21;
  Index i_4;
  SIMDShuffle *cast_20;
  SIMDReplace *cast_19;
  SIMDExtract *cast_18;
  AtomicFence *cast_17;
  AtomicNotify *cast_16;
  AtomicWait *cast_15;
  AtomicCmpxchg *cast_14;
  AtomicRMW *cast_13;
  Store *cast_12;
  Load *cast_11;
  GlobalSet *cast_10;
  GlobalGet *cast_9;
  LocalSet *cast_8;
  LocalGet *cast_7;
  int i_3;
  CallIndirect *cast_6;
  int i_2;
  Call *cast_5;
  Index i_1;
  Switch *cast_4;
  Break *cast_3;
  Loop *cast_2;
  If *cast_1;
  int i;
  Block *cast;
  Expression *curr;
  Expression **currp_local;
  Scanner *self_local;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pBVar1->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_1._4_4_ = (int)sVar83;
    while (cast_1._4_4_ = cast_1._4_4_ + -1, -1 < cast_1._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_1._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    break;
  case IfId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitIf,currp);
    pIVar2 = Expression::cast<wasm::If>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::maybePushTask(&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                     ).
                     super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    ,scan,&pIVar2->ifFalse);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pIVar2->ifTrue);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pIVar2->condition);
    break;
  case LoopId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitLoop,currp);
    pLVar3 = Expression::cast<wasm::Loop>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pLVar3->body);
    break;
  case BreakId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitBreak,currp);
    pBVar4 = Expression::cast<wasm::Break>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::maybePushTask(&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                     ).
                     super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    ,scan,&pBVar4->condition);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::maybePushTask(&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                     ).
                     super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    ,scan,&pBVar4->value);
    break;
  case SwitchId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitSwitch,currp);
    pSVar5 = Expression::cast<wasm::Switch>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar5->condition);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::maybePushTask(&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                     ).
                     super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    ,scan,&pSVar5->value);
    for (cast_5._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pSVar5->targets).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        cast_5._4_4_ < sVar83; cast_5._4_4_ = cast_5._4_4_ + 1) {
    }
    break;
  case CallId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitCall,currp);
    pCVar6 = Expression::cast<wasm::Call>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar6->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_6._4_4_ = (int)sVar83;
    while (cast_6._4_4_ = cast_6._4_4_ + -1, -1 < cast_6._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar6->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_6._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    break;
  case CallIndirectId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitCallIndirect,currp);
    pCVar7 = Expression::cast<wasm::CallIndirect>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pCVar7->target);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar7->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_7._4_4_ = (int)sVar83;
    while (cast_7._4_4_ = cast_7._4_4_ + -1, -1 < cast_7._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar7->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_7._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    break;
  case LocalGetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    break;
  case LocalSetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitLocalSet,currp);
    pLVar8 = Expression::cast<wasm::LocalSet>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pLVar8->value);
    break;
  case GlobalGetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    break;
  case GlobalSetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitGlobalSet,currp);
    pGVar9 = Expression::cast<wasm::GlobalSet>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pGVar9->value);
    break;
  case LoadId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitLoad,currp);
    pLVar10 = Expression::cast<wasm::Load>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pLVar10->ptr);
    break;
  case StoreId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStore,currp);
    pSVar11 = Expression::cast<wasm::Store>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar11->value);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar11->ptr);
    break;
  case ConstId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    break;
  case UnaryId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitUnary,currp);
    pUVar27 = Expression::cast<wasm::Unary>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pUVar27->value);
    break;
  case BinaryId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitBinary,currp);
    pBVar28 = Expression::cast<wasm::Binary>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pBVar28->right);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pBVar28->left);
    break;
  case SelectId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitSelect,currp);
    pSVar29 = Expression::cast<wasm::Select>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar29->condition);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar29->ifFalse);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar29->ifTrue);
    break;
  case DropId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitDrop,currp);
    pDVar30 = Expression::cast<wasm::Drop>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pDVar30->value);
    break;
  case ReturnId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitReturn,currp);
    pRVar31 = Expression::cast<wasm::Return>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::maybePushTask(&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                     ).
                     super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    ,scan,&pRVar31->value);
    break;
  case MemorySizeId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    break;
  case MemoryGrowId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitMemoryGrow,currp);
    pMVar32 = Expression::cast<wasm::MemoryGrow>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pMVar32->delta);
    break;
  case NopId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    break;
  case UnreachableId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    break;
  case AtomicRMWId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitAtomicRMW,currp);
    pAVar12 = Expression::cast<wasm::AtomicRMW>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar12->value);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar12->ptr);
    break;
  case AtomicCmpxchgId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitAtomicCmpxchg,currp);
    pAVar13 = Expression::cast<wasm::AtomicCmpxchg>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar13->replacement);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar13->expected);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar13->ptr);
    break;
  case AtomicWaitId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitAtomicWait,currp);
    pAVar14 = Expression::cast<wasm::AtomicWait>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar14->timeout);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar14->expected);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar14->ptr);
    break;
  case AtomicNotifyId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitAtomicNotify,currp);
    pAVar15 = Expression::cast<wasm::AtomicNotify>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar15->notifyCount);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar15->ptr);
    break;
  case AtomicFenceId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    break;
  case SIMDExtractId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitSIMDExtract,currp);
    pSVar16 = Expression::cast<wasm::SIMDExtract>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar16->vec);
    break;
  case SIMDReplaceId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitSIMDReplace,currp);
    pSVar17 = Expression::cast<wasm::SIMDReplace>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar17->value);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar17->vec);
    break;
  case SIMDShuffleId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitSIMDShuffle,currp);
    pSVar18 = Expression::cast<wasm::SIMDShuffle>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar18->right);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar18->left);
    for (cast_21._4_4_ = 0; sVar19 = std::array<unsigned_char,_16UL>::size(&pSVar18->mask),
        cast_21._4_4_ < sVar19; cast_21._4_4_ = cast_21._4_4_ + 1) {
    }
    break;
  case SIMDTernaryId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitSIMDTernary,currp);
    pSVar20 = Expression::cast<wasm::SIMDTernary>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar20->c);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar20->b);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar20->a);
    break;
  case SIMDShiftId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitSIMDShift,currp);
    pSVar21 = Expression::cast<wasm::SIMDShift>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar21->shift);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar21->vec);
    break;
  case SIMDLoadId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitSIMDLoad,currp);
    pSVar22 = Expression::cast<wasm::SIMDLoad>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar22->ptr);
    break;
  case SIMDLoadStoreLaneId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitSIMDLoadStoreLane,currp);
    pSVar23 = Expression::cast<wasm::SIMDLoadStoreLane>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar23->vec);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar23->ptr);
    break;
  case MemoryInitId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitMemoryInit,currp);
    pMVar24 = Expression::cast<wasm::MemoryInit>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pMVar24->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pMVar24->offset);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pMVar24->dest);
    break;
  case DataDropId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    break;
  case MemoryCopyId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitMemoryCopy,currp);
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pMVar25->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pMVar25->source);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pMVar25->dest);
    break;
  case MemoryFillId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitMemoryFill,currp);
    pMVar26 = Expression::cast<wasm::MemoryFill>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pMVar26->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pMVar26->value);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pMVar26->dest);
    break;
  case PopId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    break;
  case RefNullId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    break;
  case RefIsNullId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitRefIsNull,currp);
    pRVar33 = Expression::cast<wasm::RefIsNull>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pRVar33->value);
    break;
  case RefFuncId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    break;
  case RefEqId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitRefEq,currp);
    pRVar34 = Expression::cast<wasm::RefEq>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pRVar34->right);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pRVar34->left);
    break;
  case TableGetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTableGet,currp);
    pTVar35 = Expression::cast<wasm::TableGet>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar35->index);
    break;
  case TableSetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTableSet,currp);
    pTVar36 = Expression::cast<wasm::TableSet>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar36->value);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar36->index);
    break;
  case TableSizeId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    break;
  case TableGrowId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTableGrow,currp);
    pTVar37 = Expression::cast<wasm::TableGrow>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar37->delta);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar37->value);
    break;
  case TableFillId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTableFill,currp);
    pTVar38 = Expression::cast<wasm::TableFill>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar38->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar38->value);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar38->dest);
    break;
  case TableCopyId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTableCopy,currp);
    pTVar39 = Expression::cast<wasm::TableCopy>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar39->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar39->source);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar39->dest);
    break;
  case TableInitId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTableInit,currp);
    pTVar40 = Expression::cast<wasm::TableInit>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar40->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar40->offset);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar40->dest);
    break;
  case TryId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTry,currp);
    pTVar41 = Expression::cast<wasm::Try>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar41->catchBodies).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_49._4_4_ = (int)sVar83;
    while (cast_49._4_4_ = cast_49._4_4_ + -1, -1 < cast_49._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar41->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_49._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    for (cast_49._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pTVar41->catchTags).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        (uint)cast_49 < sVar83; cast_49._0_4_ = (uint)cast_49 + 1) {
    }
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar41->body);
    break;
  case TryTableId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTryTable,currp);
    pTVar42 = Expression::cast<wasm::TryTable>(this);
    for (i_9 = 0; sVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                                     (&(pTVar42->sentTypes).
                                       super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>),
        i_9 < sVar83; i_9 = i_9 + 1) {
    }
    for (i_10 = 0;
        sVar83 = ArenaVectorBase<ArenaVector<bool>,_bool>::size
                           (&(pTVar42->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>),
        i_10 < sVar83; i_10 = i_10 + 1) {
    }
    for (cast_50._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pTVar42->catchDests).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        cast_50._4_4_ < sVar83; cast_50._4_4_ = cast_50._4_4_ + 1) {
    }
    for (cast_50._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pTVar42->catchTags).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        (uint)cast_50 < sVar83; cast_50._0_4_ = (uint)cast_50 + 1) {
    }
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar42->body);
    break;
  case ThrowId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitThrow,currp);
    pTVar43 = Expression::cast<wasm::Throw>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar43->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_51._4_4_ = (int)sVar83;
    while (cast_51._4_4_ = cast_51._4_4_ + -1, -1 < cast_51._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar43->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_51._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    break;
  case RethrowId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    break;
  case ThrowRefId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitThrowRef,currp);
    pTVar44 = Expression::cast<wasm::ThrowRef>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar44->exnref);
    break;
  case TupleMakeId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTupleMake,currp);
    pTVar45 = Expression::cast<wasm::TupleMake>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar45->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_57._4_4_ = (int)sVar83;
    while (cast_57._4_4_ = cast_57._4_4_ + -1, -1 < cast_57._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar45->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_57._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    break;
  case TupleExtractId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitTupleExtract,currp);
    pTVar46 = Expression::cast<wasm::TupleExtract>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pTVar46->tuple);
    break;
  case RefI31Id:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitRefI31,currp);
    pRVar47 = Expression::cast<wasm::RefI31>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pRVar47->value);
    break;
  case I31GetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitI31Get,currp);
    pIVar48 = Expression::cast<wasm::I31Get>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pIVar48->i31);
    break;
  case CallRefId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitCallRef,currp);
    pCVar49 = Expression::cast<wasm::CallRef>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pCVar49->target);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar49->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_61._4_4_ = (int)sVar83;
    while (cast_61._4_4_ = cast_61._4_4_ + -1, -1 < cast_61._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar49->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_61._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    break;
  case RefTestId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitRefTest,currp);
    pRVar50 = Expression::cast<wasm::RefTest>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pRVar50->ref);
    break;
  case RefCastId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitRefCast,currp);
    pRVar51 = Expression::cast<wasm::RefCast>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pRVar51->ref);
    break;
  case BrOnId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitBrOn,currp);
    pBVar52 = Expression::cast<wasm::BrOn>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pBVar52->ref);
    break;
  case StructNewId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStructNew,currp);
    pSVar53 = Expression::cast<wasm::StructNew>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pSVar53->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_65._4_4_ = (int)sVar83;
    while (cast_65._4_4_ = cast_65._4_4_ + -1, -1 < cast_65._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar53->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_65._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    break;
  case StructGetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStructGet,currp);
    pSVar54 = Expression::cast<wasm::StructGet>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar54->ref);
    break;
  case StructSetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStructSet,currp);
    pSVar55 = Expression::cast<wasm::StructSet>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar55->value);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar55->ref);
    break;
  case StructRMWId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStructRMW,currp);
    pSVar56 = Expression::cast<wasm::StructRMW>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar56->value);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar56->ref);
    break;
  case StructCmpxchgId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStructCmpxchg,currp);
    pSVar57 = Expression::cast<wasm::StructCmpxchg>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar57->replacement);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar57->expected);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar57->ref);
    break;
  case ArrayNewId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArrayNew,currp);
    pAVar58 = Expression::cast<wasm::ArrayNew>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar58->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::maybePushTask(&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                     ).
                     super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    ,scan,&pAVar58->init);
    break;
  case ArrayNewDataId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArrayNewData,currp);
    pAVar59 = Expression::cast<wasm::ArrayNewData>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar59->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar59->offset);
    break;
  case ArrayNewElemId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArrayNewElem,currp);
    pAVar60 = Expression::cast<wasm::ArrayNewElem>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar60->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar60->offset);
    break;
  case ArrayNewFixedId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArrayNewFixed,currp);
    pAVar61 = Expression::cast<wasm::ArrayNewFixed>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pAVar61->values).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_73._4_4_ = (int)sVar83;
    while (cast_73._4_4_ = cast_73._4_4_ + -1, -1 < cast_73._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pAVar61->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_73._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    break;
  case ArrayGetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArrayGet,currp);
    pAVar62 = Expression::cast<wasm::ArrayGet>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar62->index);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar62->ref);
    break;
  case ArraySetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArraySet,currp);
    pAVar63 = Expression::cast<wasm::ArraySet>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar63->value);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar63->index);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar63->ref);
    break;
  case ArrayLenId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArrayLen,currp);
    pAVar64 = Expression::cast<wasm::ArrayLen>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar64->ref);
    break;
  case ArrayCopyId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArrayCopy,currp);
    pAVar65 = Expression::cast<wasm::ArrayCopy>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar65->length);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar65->srcIndex);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar65->srcRef);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar65->destIndex);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar65->destRef);
    break;
  case ArrayFillId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArrayFill,currp);
    pAVar66 = Expression::cast<wasm::ArrayFill>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar66->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar66->value);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar66->index);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar66->ref);
    break;
  case ArrayInitDataId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArrayInitData,currp);
    pAVar67 = Expression::cast<wasm::ArrayInitData>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar67->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar67->offset);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar67->index);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar67->ref);
    break;
  case ArrayInitElemId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitArrayInitElem,currp);
    pAVar68 = Expression::cast<wasm::ArrayInitElem>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar68->size);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar68->offset);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar68->index);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pAVar68->ref);
    break;
  case RefAsId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitRefAs,currp);
    pRVar69 = Expression::cast<wasm::RefAs>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pRVar69->value);
    break;
  case StringNewId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStringNew,currp);
    pSVar70 = Expression::cast<wasm::StringNew>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::maybePushTask(&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                     ).
                     super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    ,scan,&pSVar70->end);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::maybePushTask(&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                     ).
                     super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    ,scan,&pSVar70->start);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar70->ref);
    break;
  case StringConstId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    break;
  case StringMeasureId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStringMeasure,currp);
    pSVar71 = Expression::cast<wasm::StringMeasure>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar71->ref);
    break;
  case StringEncodeId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStringEncode,currp);
    pSVar72 = Expression::cast<wasm::StringEncode>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::maybePushTask(&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                     ).
                     super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    ,scan,&pSVar72->start);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar72->array);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar72->str);
    break;
  case StringConcatId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStringConcat,currp);
    pSVar73 = Expression::cast<wasm::StringConcat>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar73->right);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar73->left);
    break;
  case StringEqId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStringEq,currp);
    pSVar74 = Expression::cast<wasm::StringEq>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar74->right);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar74->left);
    break;
  case StringWTF16GetId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStringWTF16Get,currp);
    pSVar75 = Expression::cast<wasm::StringWTF16Get>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar75->pos);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar75->ref);
    break;
  case StringSliceWTFId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStringSliceWTF,currp);
    pSVar76 = Expression::cast<wasm::StringSliceWTF>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar76->end);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar76->start);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar76->ref);
    break;
  case ContNewId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitContNew,currp);
    pCVar77 = Expression::cast<wasm::ContNew>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pCVar77->func);
    break;
  case ContBindId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitContBind,currp);
    pCVar78 = Expression::cast<wasm::ContBind>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pCVar78->cont);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar78->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_91._4_4_ = (int)sVar83;
    while (cast_91._4_4_ = cast_91._4_4_ + -1, -1 < cast_91._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar78->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_91._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    break;
  case SuspendId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitSuspend,currp);
    pSVar79 = Expression::cast<wasm::Suspend>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pSVar79->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_92._4_4_ = (int)sVar83;
    while (cast_92._4_4_ = cast_92._4_4_ + -1, -1 < cast_92._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar79->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_92._4_4_);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    break;
  case ResumeId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitResume,currp);
    pRVar80 = Expression::cast<wasm::Resume>(this);
    for (i_20 = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                           (&(pRVar80->sentTypes).
                             super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>),
        i_20 < sVar83; i_20 = i_20 + 1) {
    }
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pRVar80->cont);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pRVar80->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    i_21 = (Index)sVar83;
    while (i_21 = i_21 - 1, -1 < (int)i_21) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pRVar80->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)(int)i_21);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    for (cast_93._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pRVar80->handlerBlocks).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        cast_93._4_4_ < sVar83; cast_93._4_4_ = cast_93._4_4_ + 1) {
    }
    for (cast_93._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pRVar80->handlerTags).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        (uint)cast_93 < sVar83; cast_93._0_4_ = (uint)cast_93 + 1) {
    }
    break;
  case ResumeThrowId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitResumeThrow,currp);
    pRVar81 = Expression::cast<wasm::ResumeThrow>(this);
    for (i_24 = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                           (&(pRVar81->sentTypes).
                             super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>),
        i_24 < sVar83; i_24 = i_24 + 1) {
    }
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pRVar81->cont);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pRVar81->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    i_25 = (Index)sVar83;
    while (i_25 = i_25 - 1, -1 < (int)i_25) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pRVar81->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)(int)i_25);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
    for (cast_94._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pRVar81->handlerBlocks).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        cast_94._4_4_ < sVar83; cast_94._4_4_ = cast_94._4_4_ + 1) {
    }
    for (cast_94._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pRVar81->handlerTags).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        (uint)cast_94 < sVar83; cast_94._0_4_ = (uint)cast_94 + 1) {
    }
    break;
  case StackSwitchId:
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                ::doVisitStackSwitch,currp);
    pSVar82 = Expression::cast<wasm::StackSwitch>(this);
    Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               ,scan,&pSVar82->cont);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pSVar82->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    local_3b4 = (int)sVar83;
    while (local_3b4 = local_3b4 + -1, -1 < local_3b4) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar82->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)local_3b4);
      Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      ::pushTask(&(self->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 ,scan,ppEVar84);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }